

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O2

int __thiscall
Imf_3_4::TypedAttribute<std::vector<float,_std::allocator<float>_>_>::copy
          (TypedAttribute<std::vector<float,_std::allocator<float>_>_> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  TypedAttribute<std::vector<float,_std::allocator<float>_>_> *this_00;
  
  this_00 = (TypedAttribute<std::vector<float,_std::allocator<float>_>_> *)operator_new(0x20);
  (this_00->super_Attribute)._vptr_Attribute = (_func_int **)0x0;
  (this_00->_value).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->_value).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->_value).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TypedAttribute(this_00);
  (*(this_00->super_Attribute)._vptr_Attribute[6])(this_00,this);
  return (int)this_00;
}

Assistant:

Attribute*
TypedAttribute<T>::copy () const
{
    Attribute* attribute = new TypedAttribute<T> ();
    attribute->copyValueFrom (*this);
    return attribute;
}